

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O3

uint64_t yactfr::internal::anon_unknown_0::readFlUIntBe12At5(uint8_t *buf)

{
  return (ulong)((*buf & 7) * 0x200 + (uint)buf[1] * 2 | (uint)(buf[2] >> 7));
}

Assistant:

std::uint64_t readFlUIntBe12At5(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[0];
    res <<= 8;
    res |= buf[1];
    res <<= 1;
    res |= (buf[2] >> 7);
    res &= UINT64_C(0xfff);
    return res;
}